

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterClose(xmlTextWriterPtr writer)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 0x73;
  if ((writer != (xmlTextWriterPtr)0x0) && (writer->out != (xmlOutputBufferPtr)0x0)) {
    iVar1 = xmlOutputBufferClose(writer->out);
    writer->out = (xmlOutputBufferPtr)0x0;
    uVar2 = iVar1 >> 0x1f & -iVar1;
  }
  return uVar2;
}

Assistant:

int
xmlTextWriterClose(xmlTextWriterPtr writer)
{
    int result;

    if ((writer == NULL) || (writer->out == NULL))
        return XML_ERR_ARGUMENT;

    result = xmlOutputBufferClose(writer->out);
    writer->out = NULL;

    if (result >= 0)
        result = XML_ERR_OK;
    else
        result = -result;

    return result;
}